

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<ReturnStatementAstNode>_> * __thiscall
Parser::parseReturnStatement
          (optional<std::shared_ptr<ReturnStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool *this_00;
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  undefined1 local_90 [16];
  shared_ptr<Token> returnToken;
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [3];
  allocator<char> local_32;
  byte local_31;
  bool error;
  
  local_31 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a return",
             (allocator<char> *)
             &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_00 = &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
  expect((Parser *)&stack0xffffffffffffff80,(TokenType)this,(bool *)0xa,(string *)&local_31);
  std::__cxx11::string::~string((string *)this_00);
  skipWhiteSpace(this);
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ = 0;
  TokenBuffer::currentToken((TokenBuffer *)this_00);
  iVar1 = *(int *)(expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                   super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_ + 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
  if (iVar1 != 0x10) {
    parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)this_00,this);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)
               &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)this_00);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)this_00);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a semicolon to terminate return statement",&local_32);
  expect((Parser *)local_90,(TokenType)this,(bool *)0x10,(string *)&local_31);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  std::__cxx11::string::~string
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  if (iVar1 == 0x10) {
    if (local_31 != 0) {
LAB_0010baf3:
      (__return_storage_ptr__->
      super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_engaged = false;
      goto LAB_0010bb32;
    }
    std::make_shared<ReturnStatementAstNode,std::shared_ptr<Token>&>
              ((shared_ptr<Token> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  }
  else {
    bVar3 = local_31 == 0;
    local_31 = 1;
    if (bVar3) {
      local_31 = expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                 _M_payload.
                 super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                 super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_
                 ^ 1;
    }
    if ((local_31 & 1) != 0) goto LAB_0010baf3;
    if ((expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
         _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
         super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ & 1) ==
        0) {
      std::__throw_bad_optional_access();
    }
    std::
    make_shared<ReturnStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
              ((shared_ptr<Token> *)
               &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
               (shared_ptr<ExpressionAstNode> *)&stack0xffffffffffffff80);
  }
  _Var2._M_pi = local_50[0]._M_pi;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._16_8_;
  local_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_payload._M_value.
  super___shared_ptr<ReturnStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._17_7_ = 0;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<ReturnStatementAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<ReturnStatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ReturnStatementAstNode>_>._M_engaged = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
LAB_0010bb32:
  std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)
             &returnToken.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&returnToken);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ReturnStatementAstNode>>
Parser::parseReturnStatement() noexcept {
  bool error = false;

  auto returnToken = this->expect(TokenType::Return, error, "Expected a return");

  this->skipWhiteSpace();

  bool foundExpression = false;
  std::optional<std::shared_ptr<ExpressionAstNode>> expression{std::nullopt};

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::SemiColon) {
    foundExpression = true;
    expression = this->parseExpression();
  }

  this->expect(TokenType::SemiColon, error, "Expected a semicolon to terminate return statement");

  if (foundExpression) {
    error = error || !expression;
  }

  if (error) { return std::nullopt; }

  if (foundExpression) {
    return std::make_shared<ReturnStatementAstNode>(returnToken, expression.value());
  }

  return std::make_shared<ReturnStatementAstNode>(returnToken);
}